

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3.h
# Opt level: O0

void ncnn::convdw3x3s2_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias)

{
  float *pfVar1;
  Mat *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  float sum;
  int remain;
  int i;
  float *k2;
  float *k1;
  float *k0;
  float *r2;
  float *r1;
  float *r0;
  float *img0;
  float *outptr;
  float *kernel0;
  float bias0;
  Mat out;
  int g;
  float *bias;
  float *kernel;
  int tailstep;
  int group;
  int outh;
  int outw;
  int w;
  float local_120;
  float in_stack_fffffffffffffee4;
  int in_stack_fffffffffffffee8;
  int iVar2;
  int in_stack_fffffffffffffeec;
  float *local_f8;
  float *local_f0;
  float *local_e8;
  Mat local_d0;
  float *local_a0;
  float *local_98;
  float *local_90;
  float local_84;
  Mat local_80;
  int local_4c;
  float *local_48;
  float *local_40;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  Mat *local_20;
  
  local_24 = *(int *)(in_RDI + 0x1c);
  local_28 = *(int *)(in_RSI + 0x1c);
  local_2c = *(int *)(in_RSI + 0x20);
  local_30 = *(int *)(in_RDI + 0x24);
  local_34 = local_24 * 2 + local_28 * -2;
  local_20 = in_RCX;
  local_40 = Mat::operator_cast_to_float_(in_RDX);
  local_48 = Mat::operator_cast_to_float_(local_20);
  for (local_4c = 0; local_4c < local_30; local_4c = local_4c + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 (int)in_stack_fffffffffffffee4);
    if (local_48 == (float *)0x0) {
      local_120 = 0.0;
    }
    else {
      local_120 = local_48[local_4c];
    }
    local_84 = local_120;
    local_90 = local_40 + local_4c * 9;
    local_98 = Mat::operator_cast_to_float_(&local_80);
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 (int)in_stack_fffffffffffffee4);
    pfVar1 = Mat::operator_cast_to_float_(&local_d0);
    Mat::~Mat((Mat *)0x140bd3);
    local_f0 = pfVar1 + local_24;
    local_f8 = pfVar1 + (local_24 << 1);
    local_e8 = pfVar1;
    for (in_stack_fffffffffffffeec = 0; iVar2 = local_28, in_stack_fffffffffffffeec < local_2c;
        in_stack_fffffffffffffeec = in_stack_fffffffffffffeec + 1) {
      for (; 0 < iVar2; iVar2 = iVar2 + -1) {
        in_stack_fffffffffffffee4 =
             local_f8[2] * local_90[8] +
             local_f8[1] * local_90[7] +
             *local_f8 * local_90[6] +
             local_f0[2] * local_90[5] +
             local_f0[1] * local_90[4] +
             *local_f0 * local_90[3] +
             local_e8[2] * local_90[2] +
             local_e8[1] * local_90[1] + *local_e8 * *local_90 + local_84;
        *local_98 = in_stack_fffffffffffffee4;
        local_e8 = local_e8 + 2;
        local_f0 = local_f0 + 2;
        local_f8 = local_f8 + 2;
        local_98 = local_98 + 1;
      }
      local_e8 = local_e8 + local_34;
      local_f0 = local_f0 + local_34;
      local_f8 = local_f8 + local_34;
      in_stack_fffffffffffffee8 = iVar2;
    }
    local_a0 = pfVar1;
    Mat::~Mat((Mat *)0x140ead);
  }
  return;
}

Assistant:

static void convdw3x3s2_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = w - 2*outw + w;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for
    for (int g=0; g<group; g++)
    {
        Mat out = top_blob.channel(g);

        const float bias0 = bias ? bias[g] : 0.f;

        const float* kernel0 = kernel + g*9;

        float* outptr = out;

        const float* img0 = bottom_blob.channel(g);

        const float* r0 = img0;
        const float* r1 = img0 + w;
        const float* r2 = img0 + w*2;

        const float* k0 = kernel0;
        const float* k1 = kernel0 + 3;
        const float* k2 = kernel0 + 6;

        int i = 0;

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain>0; remain--)
            {
                float sum = bias0;
                sum += r0[0] * k0[0];
                sum += r0[1] * k0[1];
                sum += r0[2] * k0[2];
                sum += r1[0] * k1[0];
                sum += r1[1] * k1[1];
                sum += r1[2] * k1[2];
                sum += r2[0] * k2[0];
                sum += r2[1] * k2[1];
                sum += r2[2] * k2[2];

                *outptr = sum;

                r0 += 2;
                r1 += 2;
                r2 += 2;
                outptr++;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }

    }
}